

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_7246::test_art_is_empty(void **param_1)

{
  _Bool _Var1;
  Value val;
  char *key;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  undefined4 in_stack_fffffffffffffedc;
  int line;
  art_t *art_00;
  art_key_chunk_t *key_00;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffef0;
  art_t in_stack_ffffffffffffff08;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
  *in_stack_ffffffffffffff10;
  initializer_list<(anonymous_namespace)::Value> in_stack_ffffffffffffff18;
  Value local_d8;
  Value local_c8;
  Value local_b8;
  Value local_a8;
  undefined1 *local_98;
  undefined8 local_90;
  art_key_chunk_t local_59;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  char **local_30;
  undefined8 local_28;
  
  local_38 = "001005";
  local_48 = "000003";
  pcStack_40 = "000004";
  local_58 = "000001";
  pcStack_50 = "000002";
  local_30 = &local_58;
  local_28 = 5;
  key_00 = &local_59;
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)0x102cea);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_ffffffffffffff10,
             (initializer_list<const_char_*>)in_stack_ffffffffffffff18,
             (allocator_type *)in_stack_ffffffffffffff08.root);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)0x102d1b);
  Value::Value((Value *)&stack0xffffffffffffff18,1);
  Value::Value(&local_d8,2);
  Value::Value(&local_c8,3);
  Value::Value(&local_b8,4);
  Value::Value(&local_a8,5);
  local_98 = &stack0xffffffffffffff18;
  local_90 = 5;
  art_00 = (art_t *)&stack0xffffffffffffff17;
  std::allocator<(anonymous_namespace)::Value>::allocator
            ((allocator<(anonymous_namespace)::Value> *)0x102d9b);
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,
             (allocator_type *)in_stack_ffffffffffffff08.root);
  std::allocator<(anonymous_namespace)::Value>::~allocator
            ((allocator<(anonymous_namespace)::Value> *)0x102dc9);
  assert_art_valid(art_00);
  _Var1 = art_is_empty((art_t *)&stack0xffffffffffffff08);
  line = CONCAT13(_Var1,(int3)in_stack_fffffffffffffedc);
  _assert_true((unsigned_long)in_stack_fffffffffffffef0,(char *)key_00,(char *)art_00,line);
  Value::Value((Value *)&stack0xfffffffffffffef0,1);
  art_insert((art_t *)in_stack_fffffffffffffef0,key_00,(art_val_t *)art_00);
  assert_art_valid(art_00);
  _Var1 = art_is_empty((art_t *)&stack0xffffffffffffff08);
  _assert_true((unsigned_long)in_stack_fffffffffffffef0,(char *)key_00,(char *)art_00,
               CONCAT13((char)((uint)line >> 0x18),CONCAT12(_Var1,(short)line)));
  art_free((art_t *)0x102e95);
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::~vector
            (in_stack_fffffffffffffef0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffef0);
  return;
}

Assistant:

DEFINE_TEST(test_art_is_empty) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};

    art_t art{NULL};
    assert_art_valid(&art);
    assert_true(art_is_empty(&art));
    const char* key = "000001";
    Value val{1};
    art_insert(&art, (art_key_chunk_t*)key, &val);
    assert_art_valid(&art);
    assert_false(art_is_empty(&art));
    art_free(&art);
}